

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.cpp
# Opt level: O0

void __thiscall CVmMetaTable::ensure_space(CVmMetaTable *this,size_t entries,size_t increment)

{
  void *pvVar1;
  long in_RDX;
  ulong in_RSI;
  long *in_RDI;
  size_t new_size;
  
  if ((ulong)in_RDI[3] <= in_RSI) {
    in_RDI[3] = in_RDX + in_RDI[3];
    if ((ulong)in_RDI[3] < in_RSI) {
      in_RDI[3] = in_RSI;
    }
    if (*in_RDI == 0) {
      pvVar1 = malloc(in_RDI[3] * 0x38);
      *in_RDI = (long)pvVar1;
    }
    else {
      pvVar1 = realloc((void *)*in_RDI,in_RDI[3] * 0x38);
      *in_RDI = (long)pvVar1;
    }
  }
  return;
}

Assistant:

void CVmMetaTable::ensure_space(size_t entries, size_t increment)
{
    /* if we don't have enough space, allocate more */
    if (entries >= alloc_)
    {
        size_t new_size;
        
        /* increase the allocation size by the given increment */
        alloc_ += increment;

        /* if it's still too small, bump it up to the required size */
        if (alloc_ < entries)
            alloc_ = entries;

        /* compute the new size */
        new_size = alloc_ * sizeof(table_[0]);
        
        /* 
         *   if we have a table already, reallocate it at the larger size;
         *   otherwise, allocate a new table 
         */
        if (table_ != 0)
            table_ = (vm_meta_entry_t *)t3realloc(table_, new_size);
        else
            table_ = (vm_meta_entry_t *)t3malloc(new_size);
    }
}